

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocator_T::CreatePool(VmaAllocator_T *this,VmaPoolCreateInfo *pCreateInfo,VmaPool *pPool)

{
  uint32_t uVar1;
  VkResult VVar2;
  VmaPool_T *pVVar3;
  undefined8 *in_RDX;
  uint *in_RSI;
  VmaAllocator_T *in_RDI;
  VkDeviceSize unaff_retaddr;
  VmaPoolCreateInfo *in_stack_00000008;
  VmaAllocator in_stack_00000010;
  VmaPool_T *in_stack_00000018;
  VmaMutexLockWrite lock;
  VkResult res;
  VkDeviceSize preferredBlockSize;
  VmaPoolCreateInfo newCreateInfo;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar4;
  VmaIntrusiveLinkedList<VmaPoolListItemTraits> *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff8c;
  VmaAllocator_T *in_stack_ffffffffffffff90;
  undefined1 local_58 [16];
  ulong local_48;
  ulong local_40;
  undefined8 *local_20;
  uint *local_18;
  VkResult local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  memcpy(local_58,in_RSI,0x38);
  if (local_40 == 0) {
    local_40 = 0xffffffffffffffff;
  }
  if (local_40 < local_48) {
    local_4 = VK_ERROR_INITIALIZATION_FAILED;
  }
  else {
    uVar4 = *local_18;
    uVar1 = GetMemoryTypeCount(in_RDI);
    if ((uVar4 < uVar1) && ((1 << ((byte)*local_18 & 0x1f) & in_RDI->m_GlobalMemoryTypeBits) != 0))
    {
      CalcPreferredBlockSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pVVar3 = VmaAllocate<VmaPool_T>((VmaAllocator)0x2ffd88);
      VmaPool_T::VmaPool_T(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      *local_20 = pVVar3;
      VVar2 = VmaBlockVector::CreateMinBlocks((VmaBlockVector *)in_RDI);
      if (VVar2 == VK_SUCCESS) {
        VmaMutexLockWrite::VmaMutexLockWrite
                  ((VmaMutexLockWrite *)in_stack_ffffffffffffff80,(VmaRWMutex *)in_RDI,
                   SUB41(uVar4 >> 0x18,0));
        pVVar3 = (VmaPool_T *)*local_20;
        uVar1 = in_RDI->m_NextPoolId;
        in_RDI->m_NextPoolId = uVar1 + 1;
        VmaPool_T::SetId(pVVar3,uVar1);
        VmaIntrusiveLinkedList<VmaPoolListItemTraits>::PushBack
                  (in_stack_ffffffffffffff80,(ItemType *)in_RDI);
        VmaMutexLockWrite::~VmaMutexLockWrite
                  ((VmaMutexLockWrite *)CONCAT44(uVar4,in_stack_ffffffffffffff70));
        local_4 = VK_SUCCESS;
      }
      else {
        vma_delete<VmaPool_T>((VmaAllocator)CONCAT44(uVar4,in_stack_ffffffffffffff70),pVVar3);
        *local_20 = 0;
        local_4 = VVar2;
      }
    }
    else {
      local_4 = VK_ERROR_FEATURE_NOT_PRESENT;
    }
  }
  return local_4;
}

Assistant:

VkResult VmaAllocator_T::CreatePool(const VmaPoolCreateInfo* pCreateInfo, VmaPool* pPool)
{
    VMA_DEBUG_LOG("  CreatePool: MemoryTypeIndex=%u, flags=%u", pCreateInfo->memoryTypeIndex, pCreateInfo->flags);

    VmaPoolCreateInfo newCreateInfo = *pCreateInfo;

    // Protection against uninitialized new structure member. If garbage data are left there, this pointer dereference would crash.
    if(pCreateInfo->pMemoryAllocateNext)
    {
        VMA_ASSERT(((const VkBaseInStructure*)pCreateInfo->pMemoryAllocateNext)->sType != 0);
    }

    if(newCreateInfo.maxBlockCount == 0)
    {
        newCreateInfo.maxBlockCount = SIZE_MAX;
    }
    if(newCreateInfo.minBlockCount > newCreateInfo.maxBlockCount)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }
    // Memory type index out of range or forbidden.
    if(pCreateInfo->memoryTypeIndex >= GetMemoryTypeCount() ||
        ((1u << pCreateInfo->memoryTypeIndex) & m_GlobalMemoryTypeBits) == 0)
    {
        return VK_ERROR_FEATURE_NOT_PRESENT;
    }
    if(newCreateInfo.minAllocationAlignment > 0)
    {
        VMA_ASSERT(VmaIsPow2(newCreateInfo.minAllocationAlignment));
    }

    const VkDeviceSize preferredBlockSize = CalcPreferredBlockSize(newCreateInfo.memoryTypeIndex);

    *pPool = vma_new(this, VmaPool_T)(this, newCreateInfo, preferredBlockSize);

    VkResult res = (*pPool)->m_BlockVector.CreateMinBlocks();
    if(res != VK_SUCCESS)
    {
        vma_delete(this, *pPool);
        *pPool = VMA_NULL;
        return res;
    }

    // Add to m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        (*pPool)->SetId(m_NextPoolId++);
        m_Pools.PushBack(*pPool);
    }

    return VK_SUCCESS;
}